

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsInit(void)

{
  void *p_00;
  void *p;
  
  p_00 = sqlite3_malloc(10);
  if (p_00 == (void *)0x0) {
    p._4_4_ = 7;
  }
  else {
    sqlite3_free(p_00);
    p._4_4_ = sqlite3_os_init();
  }
  return p._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsInit(void){
  void *p = sqlite3_malloc(10);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  sqlite3_free(p);
  return sqlite3_os_init();
}